

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_nil(FuncState *fs,int from,int n)

{
  uint uVar1;
  int iVar2;
  Instruction *pIVar3;
  int pl;
  int pfrom;
  Instruction *previous;
  int l;
  int n_local;
  int from_local;
  FuncState *fs_local;
  
  previous._4_4_ = from + n + -1;
  pIVar3 = previousinstruction(fs);
  if ((*pIVar3 & 0x7f) == 8) {
    uVar1 = *pIVar3 >> 7 & 0xff;
    iVar2 = uVar1 + (*pIVar3 >> 0x10 & 0xff);
    if ((((int)uVar1 <= from) && (from <= iVar2 + 1)) ||
       ((from <= (int)uVar1 && ((int)uVar1 <= from + n)))) {
      l = from;
      if ((int)uVar1 < from) {
        l = uVar1;
      }
      if (previous._4_4_ < iVar2) {
        previous._4_4_ = iVar2;
      }
      *pIVar3 = *pIVar3 & 0xffff807f | (l & 0xffU) << 7;
      *pIVar3 = *pIVar3 & 0xff00ffff | (previous._4_4_ - l & 0xffU) << 0x10;
      return;
    }
  }
  luaK_codeABCk(fs,OP_LOADNIL,from,n + -1,0,0);
  return;
}

Assistant:

void luaK_nil (FuncState *fs, int from, int n) {
  int l = from + n - 1;  /* last register to set nil */
  Instruction *previous = previousinstruction(fs);
  if (GET_OPCODE(*previous) == OP_LOADNIL) {  /* previous is LOADNIL? */
    int pfrom = GETARG_A(*previous);  /* get previous range */
    int pl = pfrom + GETARG_B(*previous);
    if ((pfrom <= from && from <= pl + 1) ||
        (from <= pfrom && pfrom <= l + 1)) {  /* can connect both? */
      if (pfrom < from) from = pfrom;  /* from = min(from, pfrom) */
      if (pl > l) l = pl;  /* l = max(l, pl) */
      SETARG_A(*previous, from);
      SETARG_B(*previous, l - from);
      return;
    }  /* else go through */
  }
  luaK_codeABC(fs, OP_LOADNIL, from, n - 1, 0);  /* else no optimization */
}